

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

seconds32 __thiscall libtorrent::aux::torrent::seeding_time(torrent *this)

{
  bool bVar1;
  rep_conflict rVar2;
  time_point tVar3;
  
  bVar1 = is_seed(this);
  if ((bVar1) && (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0)) {
    tVar3 = time_now();
    rVar2 = (int)(((long)tVar3.__d.__r + (long)(this->m_became_seed).__d.__r * -1000000000) /
                 1000000000) + (this->m_seeding_time).__r;
  }
  else {
    rVar2 = (this->m_seeding_time).__r;
  }
  return (seconds32)rVar2;
}

Assistant:

seconds32 torrent::seeding_time() const
	{
		if(!is_seed() || is_paused())
			return m_seeding_time;
		// m_seeding_time does not account for the current "session", just the
		// time before we last started this torrent. To get the current time, we
		// need to add the time since we started it
		return m_seeding_time + duration_cast<seconds32>(
			aux::time_now() - m_became_seed);
	}